

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_read_mtx_crd_data(FILE *f,int M,int N,int nz,int *I,int *J,double *val,char *matcode)

{
  int iVar1;
  int local_3c;
  int i;
  int *J_local;
  int *I_local;
  int nz_local;
  int N_local;
  int M_local;
  FILE *f_local;
  
  if (matcode[2] == 'C') {
    for (local_3c = 0; local_3c < nz; local_3c = local_3c + 1) {
      iVar1 = __isoc99_fscanf(f,"%d %d %lg %lg",I + local_3c,J + local_3c,val + (local_3c << 1),
                              val + (local_3c * 2 + 1));
      if (iVar1 != 4) {
        return 0xc;
      }
    }
  }
  else if (matcode[2] == 'R') {
    for (local_3c = 0; local_3c < nz; local_3c = local_3c + 1) {
      iVar1 = __isoc99_fscanf(f,"%d %d %lg\n",I + local_3c,J + local_3c,val + local_3c);
      if (iVar1 != 3) {
        return 0xc;
      }
    }
  }
  else {
    if (matcode[2] != 'P') {
      return 0xf;
    }
    for (local_3c = 0; local_3c < nz; local_3c = local_3c + 1) {
      iVar1 = __isoc99_fscanf(f,"%d %d",I + local_3c,J + local_3c);
      if (iVar1 != 2) {
        return 0xc;
      }
    }
  }
  return 0;
}

Assistant:

int mm_read_mtx_crd_data(FILE *f, int M, int N, int nz, int I[], int J[],
                         double val[], MM_typecode matcode) {
    int i;
    if (mm_is_complex(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d %lg %lg", &I[i], &J[i], &val[2 * i], &val[2 * i + 1])
                != 4)
                return MM_PREMATURE_EOF;
    } else if (mm_is_real(matcode)) {
        for (i = 0; i < nz; i++) {
            if (fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i])
                != 3)
                return MM_PREMATURE_EOF;

        }
    } else if (mm_is_pattern(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d", &I[i], &J[i])
                != 2)
                return MM_PREMATURE_EOF;
    } else
        return MM_UNSUPPORTED_TYPE;

    return 0;

}